

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.c
# Opt level: O1

void Mio_Init(Abc_Frame_t *pAbc)

{
  Cmd_CommandAdd(pAbc,"SC mapping","read_genlib",Mio_CommandReadGenlib,0);
  Cmd_CommandAdd(pAbc,"SC mapping","write_genlib",Mio_CommandWriteGenlib,0);
  Cmd_CommandAdd(pAbc,"SC mapping","print_genlib",Mio_CommandPrintGenlib,0);
  Cmd_CommandAdd(pAbc,"SC mapping","read_library",Mio_CommandReadGenlib,0);
  Cmd_CommandAdd(pAbc,"SC mapping","write_library",Mio_CommandWriteGenlib,0);
  Cmd_CommandAdd(pAbc,"SC mapping","print_library",Mio_CommandPrintGenlib,0);
  return;
}

Assistant:

void Mio_Init( Abc_Frame_t * pAbc )
{
//    Cmd_CommandAdd( pAbc, "SC mapping", "read_liberty",   Mio_CommandReadLiberty,  0 ); 

    Cmd_CommandAdd( pAbc, "SC mapping", "read_genlib",    Mio_CommandReadGenlib,  0 ); 
    Cmd_CommandAdd( pAbc, "SC mapping", "write_genlib",   Mio_CommandWriteGenlib, 0 ); 
    Cmd_CommandAdd( pAbc, "SC mapping", "print_genlib",   Mio_CommandPrintGenlib, 0 ); 

    Cmd_CommandAdd( pAbc, "SC mapping", "read_library",   Mio_CommandReadGenlib,  0 ); 
    Cmd_CommandAdd( pAbc, "SC mapping", "write_library",  Mio_CommandWriteGenlib, 0 ); 
    Cmd_CommandAdd( pAbc, "SC mapping", "print_library",  Mio_CommandPrintGenlib, 0 ); 
}